

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O3

int jpc_dec_process_siz(jpc_dec_t *dec,jpc_ms_t *ms)

{
  jpc_sizcomp_t *pjVar1;
  uint_fast32_t uVar2;
  uint_fast32_t uVar3;
  uint_fast32_t uVar4;
  uint_fast32_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  int iVar16;
  jpc_dec_cp_t *pjVar17;
  jpc_dec_cmpt_t *pjVar18;
  ulong uVar19;
  jpc_dec_tile_t *pjVar20;
  jpc_dec_tcomp_t *pjVar21;
  uint_fast32_t *puVar22;
  ulong uVar23;
  jpc_dec_tile_t *pjVar24;
  long lVar25;
  char *fmt;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar34;
  undefined1 auVar33 [16];
  int local_40;
  
  uVar19 = (ms->parms).sot.len;
  uVar28 = (ms->parms).siz.height;
  if (((uVar19 == 0) ||
      (auVar10._8_8_ = 0, auVar10._0_8_ = uVar19, auVar13._8_8_ = 0, auVar13._0_8_ = uVar28,
      SUB168(auVar10 * auVar13,8) == 0)) &&
     ((uVar23 = dec->max_samples, uVar23 == 0 ||
      (uVar28 * uVar19 < uVar23 || uVar28 * uVar19 - uVar23 == 0)))) {
    uVar26 = (ms->parms).siz.tilewidth;
    uVar29 = (ms->parms).siz.tileheight;
    if (((uVar26 == 0) ||
        (auVar11._8_8_ = 0, auVar11._0_8_ = uVar26, auVar33._8_8_ = 0, auVar33._0_8_ = uVar29,
        SUB168(auVar11 * auVar33,8) == 0)) &&
       ((uVar23 == 0 || (uVar29 * uVar26 < uVar23 || uVar29 * uVar26 - uVar23 == 0)))) {
      uVar2 = (ms->parms).siz.yoff;
      dec->xstart = (ms->parms).siz.xoff;
      dec->ystart = uVar2;
      dec->xend = uVar19;
      dec->yend = uVar28;
      dec->tilewidth = uVar26;
      dec->tileheight = uVar29;
      uVar2 = (ms->parms).siz.tileyoff;
      dec->tilexoff = (ms->parms).siz.tilexoff;
      dec->tileyoff = uVar2;
      iVar15 = (int)(ms->parms).siz.numcomps;
      dec->numcomps = iVar15;
      pjVar17 = jpc_dec_cp_create((long)iVar15);
      dec->cp = pjVar17;
      if (pjVar17 == (jpc_dec_cp_t *)0x0) {
        return -1;
      }
      pjVar18 = (jpc_dec_cmpt_t *)jas_alloc2((long)dec->numcomps,0x40);
      dec->cmpts = pjVar18;
      if (pjVar18 == (jpc_dec_cmpt_t *)0x0) {
        return -1;
      }
      uVar19 = (ulong)dec->numcomps;
      if ((long)uVar19 < 1) {
        uVar28 = dec->max_samples;
        bVar30 = uVar28 != 0;
      }
      else {
        pjVar1 = (ms->parms).siz.comps;
        uVar2 = dec->xend;
        uVar3 = dec->xstart;
        uVar4 = dec->ystart;
        uVar5 = dec->yend;
        puVar22 = &pjVar18->hsubstep;
        uVar28 = 0;
        uVar23 = 0;
        do {
          puVar22[-2] = (ulong)pjVar1[uVar28].prec;
          *(bool *)(puVar22 + -1) = pjVar1[uVar28].sgnd != '\0';
          uVar29 = (ulong)pjVar1[uVar28].hsamp;
          ((jpc_dec_cmpt_t *)(puVar22 + -6))->hstep = uVar29;
          uVar26 = (ulong)pjVar1[uVar28].vsamp;
          puVar22[-5] = uVar26;
          uVar27 = ((uVar26 + uVar5) - 1) / uVar26 - ((uVar26 + uVar4) - 1) / uVar26;
          uVar26 = ((uVar29 + uVar2) - 1) / uVar29 - ((uVar29 + uVar3) - 1) / uVar29;
          puVar22[-4] = uVar26;
          puVar22[-3] = uVar27;
          *(undefined1 (*) [16])puVar22 = (undefined1  [16])0x0;
          if (((uVar26 != 0) &&
              (auVar12._8_8_ = 0, auVar12._0_8_ = uVar26, auVar14._8_8_ = 0, auVar14._0_8_ = uVar27,
              SUB168(auVar12 * auVar14,8) != 0)) ||
             (bVar30 = CARRY8(uVar23,uVar27 * uVar26), uVar23 = uVar23 + uVar27 * uVar26, bVar30))
          goto LAB_0011d0ec;
          uVar28 = uVar28 + 1;
          puVar22 = puVar22 + 8;
        } while (uVar19 != uVar28);
        uVar28 = dec->max_samples;
        bVar30 = uVar28 != 0;
        if ((bVar30) && (uVar28 < uVar23)) {
          jas_eprintf("maximum number of samples exceeded (%zu > %zu)\n",uVar23,uVar28);
          return -1;
        }
      }
      dec->image = (jas_image_t *)0x0;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = dec->tilewidth;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = ~dec->tilexoff + dec->xend + dec->tilewidth;
      uVar23 = SUB168(auVar8 / auVar6,0);
      iVar16 = SUB164(auVar8 / auVar6,0);
      dec->numhtiles = iVar16;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dec->tileheight;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = ~dec->tileyoff + dec->yend + dec->tileheight;
      uVar26 = SUB168(auVar9 / auVar7,0);
      iVar15 = SUB164(auVar9 / auVar7,0);
      dec->numvtiles = iVar15;
      if (iVar16 < 0) {
        __assert_fail("dec->numhtiles >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                      ,0x534,"int jpc_dec_process_siz(jpc_dec_t *, jpc_ms_t *)");
      }
      if (iVar15 < 0) {
        __assert_fail("dec->numvtiles >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                      ,0x535,"int jpc_dec_process_siz(jpc_dec_t *, jpc_ms_t *)");
      }
      uVar29 = (uVar26 & 0x7fffffff) * (uVar23 & 0x7fffffff);
      if (0x7fffffff < uVar29) {
        return -1;
      }
      if ((bool)(bVar30 & (uVar28 >> 8 <= uVar29 && uVar29 - (uVar28 >> 8) != 0))) {
        return -1;
      }
      if ((bVar30) && (uVar19 = uVar28 / uVar19 >> 4, uVar19 <= uVar29 && uVar29 - uVar19 != 0)) {
        return -1;
      }
      dec->numtiles = (int)uVar29;
      iVar15 = jas_getdbglevel();
      if (9 < iVar15) {
        jas_eprintf("numtiles = %d; numhtiles = %d; numvtiles = %d;\n",uVar29 & 0xffffffff,
                    uVar23 & 0xffffffff,uVar26 & 0xffffffff);
        uVar29 = (ulong)(uint)dec->numtiles;
      }
      pjVar20 = (jpc_dec_tile_t *)jas_alloc2((long)(int)uVar29,0x68);
      dec->tiles = pjVar20;
      auVar11 = _DAT_0013c1d0;
      auVar13 = _DAT_00139d70;
      auVar10 = _DAT_001384e0;
      if (pjVar20 == (jpc_dec_tile_t *)0x0) {
        return -1;
      }
      iVar15 = dec->numtiles;
      if (0 < (long)iVar15) {
        lVar25 = (long)iVar15 + -1;
        auVar31._8_4_ = (int)lVar25;
        auVar31._0_8_ = lVar25;
        auVar31._12_4_ = (int)((ulong)lVar25 >> 0x20);
        uVar19 = 0;
        auVar31 = auVar31 ^ _DAT_001384e0;
        pjVar24 = pjVar20;
        do {
          auVar32._8_4_ = (int)uVar19;
          auVar32._0_8_ = uVar19;
          auVar32._12_4_ = (int)(uVar19 >> 0x20);
          auVar33 = (auVar32 | auVar13) ^ auVar10;
          iVar16 = auVar31._4_4_;
          if ((bool)(~(auVar33._4_4_ == iVar16 && auVar31._0_4_ < auVar33._0_4_ ||
                      iVar16 < auVar33._4_4_) & 1)) {
            pjVar24->state = 3;
          }
          if ((auVar33._12_4_ != auVar31._12_4_ || auVar33._8_4_ <= auVar31._8_4_) &&
              auVar33._12_4_ <= auVar31._12_4_) {
            pjVar24[1].state = 3;
          }
          auVar33 = (auVar32 | auVar11) ^ auVar10;
          iVar34 = auVar33._4_4_;
          if (iVar34 <= iVar16 && (iVar34 != iVar16 || auVar33._0_4_ <= auVar31._0_4_)) {
            pjVar24[2].state = 3;
            pjVar24[3].state = 3;
          }
          uVar19 = uVar19 + 4;
          pjVar24 = pjVar24 + 4;
        } while ((iVar15 + 3U & 0xfffffffc) != uVar19);
        if (0 < iVar15) {
          local_40 = dec->numcomps;
          iVar15 = 0;
          do {
            iVar16 = iVar15 / dec->numhtiles;
            uVar19 = (long)iVar15 % (long)dec->numhtiles;
            pjVar20->realmode = 0;
            pjVar20->state = 0;
            uVar2 = dec->tilexoff;
            uVar3 = dec->tilewidth;
            uVar28 = uVar3 * (uVar19 & 0xffffffff) + uVar2;
            if (uVar28 <= dec->xstart) {
              uVar28 = dec->xstart;
            }
            pjVar20->xstart = uVar28;
            uVar4 = dec->tileyoff;
            uVar5 = dec->tileheight;
            uVar28 = uVar5 * (long)iVar16 + uVar4;
            if (uVar28 <= dec->ystart) {
              uVar28 = dec->ystart;
            }
            pjVar20->ystart = uVar28;
            uVar19 = ((int)uVar19 + 1) * uVar3 + uVar2;
            if (dec->xend <= uVar19) {
              uVar19 = dec->xend;
            }
            pjVar20->xend = uVar19;
            uVar19 = (long)(iVar16 + 1) * uVar5 + uVar4;
            if (dec->yend <= uVar19) {
              uVar19 = dec->yend;
            }
            pjVar20->yend = uVar19;
            pjVar20->partno = 0;
            pjVar20->numparts = 0;
            pjVar20->pi = (jpc_pi_t *)0x0;
            pjVar20->pptstab = (jpc_ppxstab_t *)0x0;
            pjVar20->pkthdrstream = (jas_stream_t *)0x0;
            pjVar20->pkthdrstreampos = 0;
            pjVar20->cp = (jpc_dec_cp_t *)0x0;
            pjVar21 = (jpc_dec_tcomp_t *)jas_alloc2((long)local_40,0x40);
            pjVar20->tcomps = pjVar21;
            if (pjVar21 == (jpc_dec_tcomp_t *)0x0) {
              return -1;
            }
            local_40 = dec->numcomps;
            if (0 < local_40) {
              pjVar18 = dec->cmpts;
              uVar2 = pjVar20->xstart;
              uVar3 = pjVar20->ystart;
              uVar4 = pjVar20->xend;
              uVar5 = pjVar20->yend;
              lVar25 = 0;
              iVar16 = local_40;
              do {
                *(undefined8 *)((long)&pjVar21->rlvls + lVar25) = 0;
                *(undefined4 *)((long)&pjVar21->numrlvls + lVar25) = 0;
                *(undefined8 *)((long)&pjVar21->data + lVar25) = 0;
                uVar19 = *(ulong *)((long)&pjVar18->hstep + lVar25);
                *(ulong *)((long)&pjVar21->xstart + lVar25) = ((uVar19 + uVar2) - 1) / uVar19;
                uVar28 = *(ulong *)((long)&pjVar18->vstep + lVar25);
                *(ulong *)((long)&pjVar21->ystart + lVar25) = ((uVar3 + uVar28) - 1) / uVar28;
                *(ulong *)((long)&pjVar21->xend + lVar25) = ((uVar19 + uVar4) - 1) / uVar19;
                *(ulong *)((long)&pjVar21->yend + lVar25) = ((uVar5 + uVar28) - 1) / uVar28;
                *(undefined8 *)((long)&pjVar21->tsfb + lVar25) = 0;
                lVar25 = lVar25 + 0x40;
                iVar16 = iVar16 + -1;
              } while (iVar16 != 0);
            }
            iVar15 = iVar15 + 1;
            pjVar20 = pjVar20 + 1;
          } while (iVar15 < dec->numtiles);
        }
      }
      dec->pkthdrstreams = (jpc_streamlist_t *)0x0;
      dec->state = 4;
      return 0;
    }
    fmt = "tile too large\n";
  }
  else {
LAB_0011d0ec:
    fmt = "image too large\n";
  }
  jas_eprintf(fmt);
  return -1;
}

Assistant:

static int jpc_dec_process_siz(jpc_dec_t *dec, jpc_ms_t *ms)
{
	jpc_siz_t *siz = &ms->parms.siz;
	int compno;
	int tileno;
	jpc_dec_tile_t *tile;
	jpc_dec_tcomp_t *tcomp;
	int htileno;
	int vtileno;
	jpc_dec_cmpt_t *cmpt;
	size_t size;
	size_t num_samples;
	size_t num_samples_delta;

	size_t total_samples;
	if (!jas_safe_size_mul(siz->width, siz->height, &total_samples) ||
	    (dec->max_samples > 0 && total_samples > dec->max_samples)) {
		jas_eprintf("image too large\n");
		return -1;
	}

	size_t tile_samples;
	if (!jas_safe_size_mul(siz->tilewidth, siz->tileheight, &tile_samples) ||
	    (dec->max_samples > 0 && tile_samples > dec->max_samples)) {
		jas_eprintf("tile too large\n");
		return -1;
	}

	dec->xstart = siz->xoff;
	dec->ystart = siz->yoff;
	dec->xend = siz->width;
	dec->yend = siz->height;
	dec->tilewidth = siz->tilewidth;
	dec->tileheight = siz->tileheight;
	dec->tilexoff = siz->tilexoff;
	dec->tileyoff = siz->tileyoff;
	dec->numcomps = siz->numcomps;

	if (!(dec->cp = jpc_dec_cp_create(dec->numcomps))) {
		return -1;
	}

	if (!(dec->cmpts = jas_alloc2(dec->numcomps, sizeof(jpc_dec_cmpt_t)))) {
		return -1;
	}

	num_samples = 0;
	for (compno = 0, cmpt = dec->cmpts; compno < dec->numcomps; ++compno,
	  ++cmpt) {
		cmpt->prec = siz->comps[compno].prec;
		cmpt->sgnd = siz->comps[compno].sgnd;
		cmpt->hstep = siz->comps[compno].hsamp;
		cmpt->vstep = siz->comps[compno].vsamp;
		cmpt->width = JPC_CEILDIV(dec->xend, cmpt->hstep) -
		  JPC_CEILDIV(dec->xstart, cmpt->hstep);
		cmpt->height = JPC_CEILDIV(dec->yend, cmpt->vstep) -
		  JPC_CEILDIV(dec->ystart, cmpt->vstep);
		cmpt->hsubstep = 0;
		cmpt->vsubstep = 0;

		if (!jas_safe_size_mul(cmpt->width, cmpt->height, &num_samples_delta)) {
			jas_eprintf("image too large\n");
			return -1;
		}
		if (!jas_safe_size_add(num_samples, num_samples_delta, &num_samples)) {
			jas_eprintf("image too large\n");
			return -1;
		}
	}

	if (dec->max_samples > 0 && num_samples > dec->max_samples) {
		jas_eprintf("maximum number of samples exceeded (%zu > %zu)\n",
		  num_samples, dec->max_samples);
		return -1;
	}

	dec->image = 0;

	dec->numhtiles = JPC_CEILDIV(dec->xend - dec->tilexoff, dec->tilewidth);
	dec->numvtiles = JPC_CEILDIV(dec->yend - dec->tileyoff, dec->tileheight);
	assert(dec->numhtiles >= 0);
	assert(dec->numvtiles >= 0);
	if (!jas_safe_size_mul(dec->numhtiles, dec->numvtiles, &size) ||
	  size > INT_MAX) {
		return -1;
	}
	if (dec->max_samples > 0 && size > dec->max_samples / 16 / 16) {
		/* avoid Denial of Service by a malicious input file
		   with millions of tiny tiles; if max_samples is
		   configured, then assume the tiles are at least
		   16x16, and don't allow more than this number of
		   tiles */
		return -1;
	}
	if (dec->max_samples > 0 && size > dec->max_samples / dec->numcomps / 16) {
		/* another DoS check: since each tile allocates an
		   array of components, this check attempts to catch
		   excessive tile*component numbers */
		return -1;
	}
	dec->numtiles = size;
	JAS_DBGLOG(10, ("numtiles = %d; numhtiles = %d; numvtiles = %d;\n",
	  dec->numtiles, dec->numhtiles, dec->numvtiles));
	if (!(dec->tiles = jas_alloc2(dec->numtiles, sizeof(jpc_dec_tile_t)))) {
		return -1;
	}

	for (tileno = 0, tile = dec->tiles; tileno < dec->numtiles; ++tileno,
	  ++tile) {
		/* initialize all tiles with JPC_TILE_DONE so
		   jpc_dec_destroy() knows which ones need a
		   jpc_dec_tilefini() call; they are not actually
		   "done", of course */
		tile->state = JPC_TILE_DONE;
	}

	for (tileno = 0, tile = dec->tiles; tileno < dec->numtiles; ++tileno,
	  ++tile) {
		htileno = tileno % dec->numhtiles;
		vtileno = tileno / dec->numhtiles;
		tile->realmode = 0;
		tile->state = JPC_TILE_INIT;
		tile->xstart = JAS_MAX(dec->tilexoff + htileno * dec->tilewidth,
		  dec->xstart);
		tile->ystart = JAS_MAX(dec->tileyoff + vtileno * dec->tileheight,
		  dec->ystart);
		tile->xend = JAS_MIN(dec->tilexoff + (htileno + 1) *
		  dec->tilewidth, dec->xend);
		tile->yend = JAS_MIN(dec->tileyoff + (vtileno + 1) *
		  dec->tileheight, dec->yend);
		tile->numparts = 0;
		tile->partno = 0;
		tile->pkthdrstream = 0;
		tile->pkthdrstreampos = 0;
		tile->pptstab = 0;
		tile->cp = 0;
		tile->pi = 0;
		if (!(tile->tcomps = jas_alloc2(dec->numcomps,
		  sizeof(jpc_dec_tcomp_t)))) {
			return -1;
		}
		for (compno = 0, cmpt = dec->cmpts, tcomp = tile->tcomps;
		  compno < dec->numcomps; ++compno, ++cmpt, ++tcomp) {
			tcomp->rlvls = 0;
			tcomp->numrlvls = 0;
			tcomp->data = 0;
			tcomp->xstart = JPC_CEILDIV(tile->xstart, cmpt->hstep);
			tcomp->ystart = JPC_CEILDIV(tile->ystart, cmpt->vstep);
			tcomp->xend = JPC_CEILDIV(tile->xend, cmpt->hstep);
			tcomp->yend = JPC_CEILDIV(tile->yend, cmpt->vstep);
			tcomp->tsfb = 0;
		}
	}

	dec->pkthdrstreams = 0;

	/* We should expect to encounter other main header marker segments
	  or an SOT marker segment next. */
	dec->state = JPC_MH;

	return 0;
}